

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

int __thiscall
CVmObject::getp_propinh
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  vm_val_t *pvVar1;
  vm_obj_id_t vVar2;
  vm_obj_id_t vVar3;
  vm_val_t *pvVar4;
  anon_union_8_8_cb74652f_for_val aVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  vm_val_t val;
  vm_obj_id_t source_obj;
  
  if (in_argc == (uint *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = 3 < *in_argc;
  }
  if (getp_propinh(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0')
  {
    getp_propinh();
  }
  iVar6 = get_prop_check_argc(retval,in_argc,&getp_propinh::desc);
  if (iVar6 != 0) {
    return 1;
  }
  val.typ = sp_[-1].typ;
  val._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  val.val = sp_[-1].val;
  if (val.typ != VM_PROP) {
    sp_ = sp_ + -1;
    err_throw(0x7db);
  }
  val.typ = sp_[-2].typ;
  val._4_4_ = *(undefined4 *)&sp_[-2].field_0x4;
  pvVar4 = sp_ + -2;
  aVar5 = sp_[-2].val;
  if (val.typ == VM_OBJ) {
    uVar8 = (ulong)sp_[-2].val.ptr & 0xffffffff;
    pvVar1 = sp_ + -3;
    val.typ = pvVar1->typ;
    val._4_4_ = *(undefined4 *)&pvVar1->field_0x4;
    vVar2 = sp_[-3].val.obj;
    aVar5 = sp_[-3].val;
    pvVar4 = sp_ + -3;
    if (pvVar1->typ == VM_OBJ) {
      if (bVar9) {
        pvVar4 = sp_ + -4;
        val.typ = pvVar4->typ;
        val._4_4_ = *(undefined4 *)&pvVar4->field_0x4;
        vVar3 = sp_[-4].val.obj;
        aVar5 = sp_[-4].val;
        if (pvVar4->typ != VM_INT) {
          sp_ = sp_ + -4;
          val.val = aVar5;
          err_throw(0x7d5);
        }
        source_obj = 0;
        uVar7 = (ulong)val.val.ptr & 0xffff;
        sp_ = sp_ + -4;
        val.val = aVar5;
        iVar6 = (*this->_vptr_CVmObject[0xf])(this,uVar7,&val,self,uVar8,vVar2,&source_obj,0);
        if (vVar3 == 4) {
          if (iVar6 != 0) {
            if (source_obj != 0) {
              self = source_obj;
            }
            retval->typ = VM_OBJ;
            (retval->val).obj = self;
            return 1;
          }
          retval->typ = VM_NIL;
          return 1;
        }
        if (vVar3 != 1) {
          err_throw(0x902);
        }
      }
      else {
        source_obj = 0;
        uVar7 = (ulong)val.val.ptr & 0xffff;
        sp_ = sp_ + -3;
        val.val = aVar5;
        iVar6 = (*this->_vptr_CVmObject[0xf])(this,uVar7,&val,self,uVar8,vVar2,&source_obj,0);
      }
      retval->typ = VM_TRUE - (iVar6 == 0);
      return 1;
    }
  }
  val.val = aVar5;
  sp_ = pvVar4;
  err_throw(0x7da);
}

Assistant:

int CVmObject::getp_propinh(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *in_argc,
                            vm_prop_id_t, vm_obj_id_t *)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    vm_val_t val;
    int flags;
    int found;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    vm_obj_id_t orig_target_obj;
    vm_obj_id_t defining_obj;
    static CVmNativeCodeDesc desc(3, 1);

    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* get the original target object */
    G_interpreter->pop_obj(vmg_ &val);
    orig_target_obj = val.val.obj;

    /* get the defining object */
    G_interpreter->pop_obj(vmg_ &val);
    defining_obj = val.val.obj;

    /* if we have the flag argument, get it; otherwise, use the default */
    if (argc >= 4)
    {
        /* get the flag value */
        G_interpreter->pop_int(vmg_ &val);
        flags = (int)val.val.intval;
    }
    else
    {
        /* use the default flags */
        flags = VMOBJ_PROPDEF_ANY;
    }

    /* presume we won't find a valid source object */
    source_obj = VM_INVALID_OBJ;

    /* look up the property */
    found = inh_prop(vmg_ prop, &val, self, orig_target_obj, defining_obj,
                     &source_obj, 0);

    /* check the flags */
    switch(flags)
    {
    case VMOBJ_PROPDEF_ANY:
        /* return true if the property is defined */
        retval->set_logical(found);
        break;

    case VMOBJ_PROPDEF_GET_CLASS:
        /* return the defining class, or nil if it's not defined */
        if (found)
        {
            /* return the source object, or 'self' if we didn't find one */
            retval->set_obj(source_obj != VM_INVALID_OBJ ? source_obj : self);
        }
        else
        {
            /* didn't find it - the return value is nil */
            retval->set_nil();
        }
        break;

    default:
        /* other flags are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
        break;
    }

    /* handled */
    return TRUE;
}